

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

string * __thiscall
testing::internal::
FormatForComparisonFailureMessage<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>::iterator,phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>::iterator>
          (string *__return_storage_ptr__,internal *this,iterator *value,iterator *param_2)

{
  stringstream ss;
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  PrintBytesInObjectTo((uchar *)this,0x10,local_188);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatForComparisonFailureMessage(const T1& value,
                                              const T2& /* other_operand */) {
  return FormatForComparison<T1, T2>::Format(value);
}